

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O2

int fits_encode_url(char *inpath,int maxlength,char *outpath,int *status)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if (*status != 0) {
    return *status;
  }
  iVar4 = maxlength + -1;
  pbVar2 = (byte *)outpath;
  for (iVar3 = 0; (bVar1 = *inpath, bVar1 != 0 && (iVar3 < iVar4)); iVar3 = iVar3 + iVar5) {
    if (((char)bVar1 < ' ') || ((&DAT_00209170)[bVar1 - 0x20] == '\0')) {
      if (iVar4 <= iVar3 + 2) goto LAB_001b2cf6;
      *pbVar2 = 0x25;
      pbVar2[1] = "0123456789ABCDEF"[bVar1 >> 4];
      pbVar2[2] = "0123456789ABCDEF"[bVar1 & 0xf];
      pbVar2 = pbVar2 + 3;
      iVar5 = 3;
    }
    else {
      *pbVar2 = bVar1;
      pbVar2 = pbVar2 + 1;
      iVar5 = 1;
    }
    inpath = (char *)((byte *)inpath + 1);
  }
  if (iVar3 == iVar4 && bVar1 != 0) {
LAB_001b2cf6:
    ffpmsg("URL input is too long to encode (fits_encode_url)");
    *status = 0x7d;
    pbVar2 = (byte *)outpath;
  }
  *pbVar2 = 0;
  return *status;
}

Assistant:

int fits_encode_url(char *inpath,  /* I URL  to be encoded                  */
                    int maxlength, /* I max number of chars that may be copied
                               to outpath, including terminating NULL. */ 
		    char *outpath, /* O output encoded URL                  */
		    int *status)
     /*
       encode all URL "unsafe" and "reserved" characters using the "%XX"
       convention, where XX stand for the two hexidecimal digits of the
       encode character's ASCII code.

       Note that the outpath length, as specified by the maxlength argument,
       should be at least as large as inpath and preferably larger (to hold
       any characters that need encoding).  If more than maxlength chars are 
       required for outpath, including the terminating NULL, outpath will
       be set to size 0 and an error status will be returned.
       
       This function was adopted from code in the libwww.a library available
       via the W3 consortium <URL: http://www.w3.org>
     */
{
  unsigned char a;
  
  char *p;
  char *q;
  char *hex = "0123456789ABCDEF";
  int iout=0;
  
unsigned const char isAcceptable[96] =
{/* 0x0 0x1 0x2 0x3 0x4 0x5 0x6 0x7 0x8 0x9 0xA 0xB 0xC 0xD 0xE 0xF */
  
    0x0,0x0,0x0,0x0,0x0,0x0,0x0,0x0,0x0,0x0,0xF,0xE,0x0,0xF,0xF,0xC, 
                                           /* 2x  !"#$%&'()*+,-./   */
    0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0x8,0x0,0x0,0x0,0x0,0x0,
                                           /* 3x 0123456789:;<=>?   */
    0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF, 
                                           /* 4x @ABCDEFGHIJKLMNO   */
    0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0x0,0x0,0x0,0x0,0xF,
                                           /* 5X PQRSTUVWXYZ[\]^_   */
    0x0,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,
                                           /* 6x `abcdefghijklmno   */
    0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0xF,0x0,0x0,0x0,0x0,0x0  
                                           /* 7X pqrstuvwxyz{\}~DEL */
};

  if(*status != 0) return(*status);
  
  /* loop over all characters in inpath until '\0' is encountered */

  for(q = outpath, p = inpath; *p && (iout < maxlength-1) ; p++)
    {
      a = (unsigned char)*p;

      /* if the charcter requires encoding then process it */

      if(!( a>=32 && a<128 && (isAcceptable[a-32])))
	{
           if (iout+2 < maxlength-1)
           {
	     /* add a '%' character to the outpath */
	     *q++ = HEX_ESCAPE;
	     /* add the most significant ASCII code hex value */
	     *q++ = hex[a >> 4];
	     /* add the least significant ASCII code hex value */
	     *q++ = hex[a & 15];
             iout += 3;
           }
           else
           {
              ffpmsg("URL input is too long to encode (fits_encode_url)");
              *status = URL_PARSE_ERROR;
              outpath[0] = 0;
              return (*status);
           }
	}
      /* else just copy the character as is */
      else 
      {
         *q++ = *p;
         iout++;
      }
    }

  /* null terminate the outpath string */

  if (*p && (iout == maxlength-1))
  {
     ffpmsg("URL input is too long to encode (fits_encode_url)");
     *status = URL_PARSE_ERROR;
     outpath[0] = 0;
     return (*status);
  }
  *q++ = 0; 
  
  return(*status);
}